

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Label __thiscall asmjit::_abi_1_10::BaseAssembler::newLabel(BaseAssembler *this)

{
  Error EVar1;
  uint32_t extraout_RDX [2];
  BaseEmitter *in_RSI;
  char *in_RDI;
  Label LVar2;
  Error err;
  LabelEntry *le;
  uint32_t labelId;
  char *pcVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  LabelEntry *local_20;
  
  if (in_RSI->_code != (CodeHolder *)0x0) {
    pcVar3 = in_RDI;
    EVar1 = CodeHolder::newLabelEntry
                      ((CodeHolder *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (LabelEntry **)in_RSI);
    if (EVar1 == 0) {
      LabelEntry::id(local_20);
      in_RDI = pcVar3;
    }
    else {
      BaseEmitter::reportError(in_RSI,(Error)((ulong)pcVar3 >> 0x20),in_RDI);
      in_RDI = pcVar3;
    }
  }
  Label::Label((Label *)in_RSI,(uint32_t)((ulong)in_RDI >> 0x20));
  LVar2.super_Operand.super_Operand_._data[0] = extraout_RDX[0];
  LVar2.super_Operand.super_Operand_._data[1] = extraout_RDX[1];
  LVar2.super_Operand.super_Operand_._0_8_ = in_RDI;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseAssembler::newLabel() {
  uint32_t labelId = Globals::kInvalidId;
  if (ASMJIT_LIKELY(_code)) {
    LabelEntry* le;
    Error err = _code->newLabelEntry(&le);
    if (ASMJIT_UNLIKELY(err))
      reportError(err);
    else
      labelId = le->id();
  }
  return Label(labelId);
}